

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmWin.c
# Opt level: O0

int Sfm_ObjRef(Sfm_Ntk_t *p,int iObj)

{
  int iVar1;
  undefined4 local_20;
  int Count;
  int iFanin;
  int i;
  int iObj_local;
  Sfm_Ntk_t *p_local;
  
  local_20 = 1;
  for (Count = 0; iVar1 = Sfm_ObjFaninNum(p,iObj), Count < iVar1; Count = Count + 1) {
    iVar1 = Sfm_ObjFanin(p,iObj,Count);
    iVar1 = Sfm_ObjRef_rec(p,iVar1);
    local_20 = iVar1 + local_20;
  }
  return local_20;
}

Assistant:

int Sfm_ObjRef( Sfm_Ntk_t * p, int iObj )
{
    int i, iFanin, Count = 1;
    Sfm_ObjForEachFanin( p, iObj, iFanin, i )
        Count += Sfm_ObjRef_rec( p, iFanin );
    return Count;
}